

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O1

char * OPENSSL_strdup(char *s)

{
  size_t sVar1;
  void *__dest;
  size_t size;
  
  if (s != (char *)0x0) {
    sVar1 = strlen(s);
    size = sVar1 + 1;
    if (size != 0) {
      __dest = OPENSSL_malloc(size);
      if (__dest != (void *)0x0) {
        memcpy(__dest,s,size);
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *OPENSSL_strdup(const char *s) {
  if (s == NULL) {
    return NULL;
  }
  // Copy the NUL terminator.
  return reinterpret_cast<char *>(OPENSSL_memdup(s, strlen(s) + 1));
}